

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O1

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  pointer ppvVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  pointer pfVar3;
  pointer pEVar4;
  pointer pPVar5;
  pointer ppvVar6;
  
  ppvVar1 = (this->aux_vecs).
            super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar6 = (this->aux_vecs).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppvVar6 != ppvVar1;
      ppvVar6 = ppvVar6 + 1) {
    pvVar2 = *ppvVar6;
    if (pvVar2 != (vector<float,_std::allocator<float>_> *)0x0) {
      pfVar3 = (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pfVar3 != (pointer)0x0) {
        operator_delete(pfVar3);
      }
      operator_delete(pvVar2);
    }
  }
  ppvVar6 = (this->aux_vecs).
            super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar6 != (pointer)0x0) {
    operator_delete(ppvVar6);
  }
  pEVar4 = (this->aligns).
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar4 != (pointer)0x0) {
    operator_delete(pEVar4);
  }
  *(code **)&this->builder_src_bwd =
       boost::program_options::error_with_option_name::error_with_option_name;
  if (*(void **)&this->field_0x378 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x378);
  }
  if (*(void **)&this->field_0x360 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x360);
  }
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x340);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x328);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x310);
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::~vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             *)&this->field_0x2f8);
  dynet::RNNBuilder::~RNNBuilder((RNNBuilder *)&this->builder_src_bwd);
  *(code **)&this->builder_src_fwd =
       boost::program_options::error_with_option_name::error_with_option_name;
  if (*(void **)&this->field_0x2a8 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x2a8);
  }
  if (*(void **)&this->field_0x290 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x290);
  }
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x270);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x258);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x240);
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::~vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             *)&this->field_0x228);
  dynet::RNNBuilder::~RNNBuilder((RNNBuilder *)&this->builder_src_fwd);
  *(code **)&this->builder = boost::program_options::error_with_option_name::error_with_option_name;
  if (*(void **)&this->field_0x1d8 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x1d8);
  }
  if (*(void **)&this->field_0x1c0 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x1c0);
  }
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x1a0);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x188);
  std::
  vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
  ::~vector((vector<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>,_std::allocator<std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>_>_>
             *)&this->field_0x170);
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::~vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             *)&this->field_0x158);
  dynet::RNNBuilder::~RNNBuilder((RNNBuilder *)&this->builder);
  pPVar5 = (this->p_Wh0).super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pPVar5 != (pointer)0x0) {
    operator_delete(pPVar5);
    return;
  }
  return;
}

Assistant:

AttentionalModel<Builder>::~AttentionalModel()
{
    for (auto v: aux_vecs)
        delete v;
}